

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_8b8d2::P::P(P *this)

{
  shared_ptr<ccs::CcsLogger> local_20;
  
  ::ccs::CcsLogger::makeStdErrLogger();
  ::ccs::CcsTracer::makeLoggingTracer((CcsTracer *)this,&local_20,false);
  if (local_20.super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  ::ccs::Parser::Parser
            (&this->parser,
             (this->trace).super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

P() :
    trace(CcsTracer::makeLoggingTracer(CcsLogger::makeStdErrLogger())),
    parser(*trace) {}